

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_long,unsigned_long(*&)(unsigned_long,unsigned_long)>
          (Memory *this,u32 offset,u32 addend,unsigned_long rhs,
          BinopFunc<unsigned_long,_unsigned_long> **func,unsigned_long *out)

{
  pointer puVar1;
  bool bVar2;
  unsigned_long uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  Enum EVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar7 = (ulong)offset;
  uVar4 = (ulong)addend;
  uVar8 = uVar4 + uVar7 + 8;
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = uVar8 <= (ulong)((long)(this->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  uVar5 = CONCAT71((int7)((ulong)this >> 8),bVar2);
  bVar9 = (addend + offset & 7) == 0;
  if (bVar9 && bVar2) {
    uVar5 = *(unsigned_long *)(puVar1 + uVar4 + uVar7);
  }
  EVar6 = Error;
  if (bVar9 && bVar2) {
    uVar3 = (**func)(uVar5,rhs);
    if (((addend + offset & 7) == 0) &&
       (puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       uVar8 <= (ulong)((long)(this->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1))) {
      *(unsigned_long *)(puVar1 + uVar4 + uVar7) = uVar3;
      *out = uVar5;
      EVar6 = Ok;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result Memory::AtomicRmw(u32 offset, u32 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}